

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void runpstr(runcxdef *ctx,char *str,int len,int sav)

{
  int in_EDX;
  void *in_RSI;
  runcxdef *in_RDI;
  runsdef val;
  runsdef *in_stack_00000030;
  runsdef *in_stack_00000038;
  runsdef *in_stack_00000040;
  uint in_stack_00000048;
  uint in_stack_0000004c;
  runcxdef *in_stack_00000050;
  runsdef local_28;
  int local_14;
  void *local_10;
  runcxdef *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if ((uint)((int)in_RDI->runcxhtop - (int)in_RDI->runcxhp) <= in_EDX + 2U) {
    runhcmp(in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000040,
            in_stack_00000038,in_stack_00000030);
  }
  oswp2(local_8->runcxhp,local_14 + 2);
  memcpy(local_8->runcxhp + 2,local_10,(long)local_14);
  local_28.runsv = (anon_union_8_4_1dda36f5_for_runsv)local_8->runcxhp;
  local_28.runstyp = '\x03';
  local_8->runcxhp = local_8->runcxhp + (local_14 + 2);
  runrepush(local_8,&local_28);
  return;
}

Assistant:

void runpstr(runcxdef *ctx, char *str, int len, int sav)
{
    runsdef val;
    
    /* allocate space and set up new string */
    runhres(ctx, len+2, sav);
    oswp2(ctx->runcxhp, len+2);
    memcpy(ctx->runcxhp+2, str, (size_t)len);

    /* push return value */
    val.runsv.runsvstr = ctx->runcxhp;
    val.runstyp = DAT_SSTRING;
    ctx->runcxhp += len + 2;
    runrepush(ctx, &val);
}